

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::InternalSerializeWithCachedSizesToArray
          (CodeGeneratorRequest *this,bool deterministic,uint8 *target)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint uVar1;
  char *data;
  string *psVar2;
  Type *pTVar3;
  Type *value;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  this_00 = &this->file_to_generate_;
  iVar5 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar5);
    data = (pTVar3->_M_dataplus)._M_p;
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar5);
    internal::WireFormatLite::VerifyUtf8String
              (data,(int)pTVar3->_M_string_length,SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar5);
    target = internal::WireFormatLite::WriteStringToArray(1,pTVar3,target);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->parameter_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    target = internal::WireFormatLite::WriteStringToArray(2,(this->parameter_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::compiler::Version>
                       (3,this->compiler_version_,deterministic,target);
  }
  iVar6 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                      (&(this->proto_file_).super_RepeatedPtrFieldBase,iVar5);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::FileDescriptorProto>
                       (0xf,value,deterministic,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    unknown_fields = CodeGeneratorRequest::unknown_fields(this);
    puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* CodeGeneratorRequest::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  for (int i = 0, n = this->file_to_generate_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->file_to_generate(i).data(), this->file_to_generate(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(1, this->file_to_generate(i), target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string parameter = 2;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->parameter().data(), this->parameter().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->parameter(), target);
  }

  // optional .google.protobuf.compiler.Version compiler_version = 3;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, *this->compiler_version_, deterministic, target);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (unsigned int i = 0, n = this->proto_file_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        15, this->proto_file(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorRequest)
  return target;
}